

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O0

pair<cs_impl::any,_cs_impl::any> *
cs_impl::
try_convert_and_check<const_std::pair<cs_impl::any,_cs_impl::any>_&,_const_std::pair<cs_impl::any,_cs_impl::any>_&,_std::pair<cs_impl::any,_cs_impl::any>,_0UL>
::convert(var *val)

{
  bool bVar1;
  pair<cs_impl::any,_cs_impl::any> *ppVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  runtime_error *this;
  char *in_stack_00000328;
  string *in_stack_fffffffffffffec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  type_info *in_stack_fffffffffffffed8;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  
  any::type((any *)in_stack_fffffffffffffed0);
  bVar1 = std::type_info::operator==
                    ((type_info *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
                     in_stack_fffffffffffffed8);
  if (!bVar1) {
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            __cxa_allocate_exception(0x28);
    std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffff08);
    std::operator+((char *)__lhs,in_stack_fffffffffffffed0);
    std::operator+(__lhs,(char *)in_stack_fffffffffffffed0);
    this = (runtime_error *)get_name_of_type<std::pair<cs_impl::any,cs_impl::any>const&>();
    cxx_demangle_abi_cxx11_(in_stack_00000328);
    std::operator+(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
    std::operator+(__lhs,(char *)this);
    any::get_type_name_abi_cxx11_((any *)__lhs);
    std::operator+(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
    cs::runtime_error::runtime_error(this,in_stack_fffffffffffffec8);
    __cxa_throw(__lhs,&cs::runtime_error::typeinfo,cs::runtime_error::~runtime_error);
  }
  ppVar2 = convert_helper<const_std::pair<cs_impl::any,_cs_impl::any>_&>::get_val((any *)0x4b256e);
  return ppVar2;
}

Assistant:

inline static _TargetT convert(cs::var &val)
		{
			if (val.type() == typeid(_TargetT))
				return convert_helper<_TargetT>::get_val(val);
			else
				throw cs::runtime_error("Invalid Argument. At " + std::to_string(index + 1) + ". Expected " +
				                        cxx_demangle(get_name_of_type<_TargetT>()) + ", provided " +
				                        val.get_type_name());
		}